

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O0

size_t Curl_is_absolute_url(char *url,char *buf,size_t buflen,_Bool guess_scheme)

{
  char cVar1;
  int iVar2;
  size_t len;
  int local_30;
  char s;
  int i;
  _Bool guess_scheme_local;
  size_t buflen_local;
  char *buf_local;
  char *url_local;
  
  local_30 = 0;
  if (buf != (char *)0x0) {
    *buf = '\0';
  }
  if ((('`' < *url) && (*url < '{')) || (('@' < *url && (*url < '[')))) {
    for (local_30 = 1;
        ((local_30 < 0x28 && (cVar1 = url[local_30], cVar1 != '\0')) &&
        ((((('/' < cVar1 && (cVar1 < ':')) || (('`' < cVar1 && (cVar1 < '{')))) ||
          (('@' < cVar1 && (cVar1 < '[')))) ||
         (((cVar1 == '+' || (cVar1 == '-')) || (cVar1 == '.')))))); local_30 = local_30 + 1) {
    }
  }
  if (((local_30 == 0) || (url[local_30] != ':')) || ((url[local_30 + 1] != '/' && (guess_scheme))))
  {
    url_local = (char *)0x0;
  }
  else {
    url_local = (char *)(long)local_30;
    if (buf != (char *)0x0) {
      buf[local_30] = '\0';
      while (iVar2 = local_30 + -1, local_30 != 0) {
        cVar1 = Curl_raw_tolower(url[iVar2]);
        buf[iVar2] = cVar1;
        local_30 = iVar2;
      }
    }
  }
  return (size_t)url_local;
}

Assistant:

size_t Curl_is_absolute_url(const char *url, char *buf, size_t buflen,
                            bool guess_scheme)
{
  int i = 0;
  DEBUGASSERT(!buf || (buflen > MAX_SCHEME_LEN));
  (void)buflen; /* only used in debug-builds */
  if(buf)
    buf[0] = 0; /* always leave a defined value in buf */
#ifdef _WIN32
  if(guess_scheme && STARTS_WITH_DRIVE_PREFIX(url))
    return 0;
#endif
  if(ISALPHA(url[0]))
    for(i = 1; i < MAX_SCHEME_LEN; ++i) {
      char s = url[i];
      if(s && (ISALNUM(s) || (s == '+') || (s == '-') || (s == '.') )) {
        /* RFC 3986 3.1 explains:
           scheme      = ALPHA *( ALPHA / DIGIT / "+" / "-" / "." )
        */
      }
      else {
        break;
      }
    }
  if(i && (url[i] == ':') && ((url[i + 1] == '/') || !guess_scheme)) {
    /* If this does not guess scheme, the scheme always ends with the colon so
       that this also detects data: URLs etc. In guessing mode, data: could
       be the host name "data" with a specified port number. */

    /* the length of the scheme is the name part only */
    size_t len = i;
    if(buf) {
      buf[i] = 0;
      while(i--) {
        buf[i] = Curl_raw_tolower(url[i]);
      }
    }
    return len;
  }
  return 0;
}